

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O1

bool check_ban(char *usite,int type,int host)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CRow *pCVar5;
  char cVar6;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  CRow row;
  char site [4608];
  long *local_14b8 [2];
  long local_14a8 [2];
  CRow local_1498;
  char *local_1478 [3];
  buffer<char> local_1460;
  char local_1440 [504];
  char local_1248 [4648];
  
  pcVar4 = capitalize(usite);
  strcpy(local_1248,pcVar4);
  cVar1 = (char)local_1248._0_4_;
  cVar6 = cVar1 + ' ';
  if (0x19 < (byte)(cVar1 + 0xbfU)) {
    cVar6 = cVar1;
  }
  local_1248[0] = cVar6;
  iVar3 = CSQLInterface::Select
                    (&RS.SQL,"site,duration FROM bans WHERE ban_type=%d AND host_type=%d",
                     (ulong)(uint)type,(ulong)(uint)host);
  if ((iVar3 != 0) && (bVar2 = CSQLInterface::End(&RS.SQL), !bVar2)) {
    do {
      pCVar5 = CSQLInterface::GetRow(&RS.SQL);
      local_1498.maxcol = pCVar5->maxcol;
      local_1498.maxrow = pCVar5->maxrow;
      local_1498.rowpos = pCVar5->rowpos;
      local_1498.row = pCVar5->row;
      pcVar4 = CRow::operator[](&local_1498,0);
      pcVar4 = strstr(local_1248,pcVar4);
      if (pcVar4 != (char *)0x0) {
        local_1460.size_ = 0;
        local_1460._vptr_buffer = (_func_int **)&PTR_grow_00457340;
        local_1460.capacity_ = 500;
        fmt.size_ = 0x22;
        fmt.data_ = "BANNED - {} just tried to connect.";
        args.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1478;
        args.desc_ = 0xc;
        local_1478[0] = local_1248;
        local_1460.ptr_ = local_1440;
        ::fmt::v9::detail::vformat_to<char>(&local_1460,fmt,args,(locale_ref)0x0);
        local_14b8[0] = local_14a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_14b8,local_1460.ptr_,local_1460.ptr_ + local_1460.size_);
        if (local_1460.ptr_ != local_1440) {
          operator_delete(local_1460.ptr_,local_1460.capacity_);
        }
        wiznet((char *)local_14b8[0],(CHAR_DATA *)0x0,(OBJ_DATA *)0x0,2,0,0);
        if (local_14b8[0] != local_14a8) {
          operator_delete(local_14b8[0],local_14a8[0] + 1);
        }
        return true;
      }
      bVar2 = CSQLInterface::End(&RS.SQL);
    } while (!bVar2);
  }
  return false;
}

Assistant:

bool check_ban(char *usite, int type, int host)
{
	char site[MSL];

	strcpy(site, capitalize(usite));
	site[0] = LOWER(site[0]);

	auto res = RS.SQL.Select("site,duration FROM bans WHERE ban_type=%d AND host_type=%d", type, host);
	if (res)
	{
		while (!RS.SQL.End())
		{
			auto row = RS.SQL.GetRow();
			if (strstr(site, row[0]) != nullptr)
			{
				auto buffer = fmt::format("BANNED - {} just tried to connect.", site); //TODO: change the rest of the sprintf calls to format
				wiznet(buffer.data(), nullptr, nullptr, WIZ_LOGINS, 0, 0);
				return true;
			}
		}
	}

	return false;
}